

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBblif.c
# Opt level: O0

void Io_WriteBblif(Abc_Ntk_t *pNtk,char *pFileName)

{
  Bbl_Man_t *p_00;
  Bbl_Man_t *p;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = Bbl_ManFromAbc(pNtk);
  Bbl_ManDumpBinaryBlif(p_00,pFileName);
  Bbl_ManStop(p_00);
  return;
}

Assistant:

void Io_WriteBblif( Abc_Ntk_t * pNtk, char * pFileName )
{
    Bbl_Man_t * p;
    p = Bbl_ManFromAbc( pNtk );
//Bbl_ManPrintStats( p );
//Bbl_ManDumpBlif( p, "test_bbl.blif" );
    Bbl_ManDumpBinaryBlif( p, pFileName );
    Bbl_ManStop( p );
}